

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O1

Vec_Ptr_t * Saig_ManCollectedDiffNodes(Aig_Man_t *p0,Aig_Man_t *p1)

{
  uint uVar1;
  Aig_Obj_t *pAVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  Aig_Obj_t *pAVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  
  Aig_ManIncrementTravId(p0);
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 1000;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(8000);
  pVVar4->pArray = ppvVar5;
  pVVar6 = p0->vObjs;
  if (0 < pVVar6->nSize) {
    lVar10 = 0;
    do {
      pAVar2 = (Aig_Obj_t *)pVVar6->pArray[lVar10];
      if (pAVar2 != (Aig_Obj_t *)0x0) {
        if (p0->pReprs == (Aig_Obj_t **)0x0) {
          pAVar7 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar7 = p0->pReprs[pAVar2->Id];
        }
        if (pAVar7 == (Aig_Obj_t *)0x0) {
          pAVar2->TravId = p0->nTravIds;
          uVar3 = *(uint *)&pAVar2->field_0x18 & 7;
          if ((uVar3 == 2) || (uVar3 - 5 < 2)) {
            uVar3 = pVVar4->nSize;
            uVar1 = pVVar4->nCap;
            if (uVar3 == uVar1) {
              if ((int)uVar1 < 0x10) {
                if (pVVar4->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc(0x80);
                }
                else {
                  ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
                }
                iVar8 = 0x10;
              }
              else {
                iVar8 = uVar1 * 2;
                if (iVar8 <= (int)uVar1) goto LAB_006f9b0f;
                if (pVVar4->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
                }
                else {
                  ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar1 << 4);
                }
              }
              pVVar4->pArray = ppvVar5;
              pVVar4->nCap = iVar8;
            }
LAB_006f9b0f:
            pVVar4->nSize = uVar3 + 1;
            pVVar4->pArray[(int)uVar3] = pAVar2;
          }
        }
        else {
          if (p1->pReprs == (Aig_Obj_t **)0x0) {
            pAVar7 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar7 = p1->pReprs[pAVar7->Id];
          }
          if (pAVar2 != pAVar7) {
            __assert_fail("pObj0 == Aig_ObjRepr( p1, pObj1 )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigWnd.c"
                          ,0x235,"Vec_Ptr_t *Saig_ManCollectedDiffNodes(Aig_Man_t *, Aig_Man_t *)");
          }
        }
      }
      lVar10 = lVar10 + 1;
      pVVar6 = p0->vObjs;
    } while (lVar10 < pVVar6->nSize);
  }
  if (0 < (long)p0->nRegs) {
    uVar3 = p0->nTruePos;
    lVar10 = 0;
    do {
      if (((int)uVar3 < 0) || (p0->vCos->nSize <= (int)(uVar3 + (int)lVar10))) {
LAB_006f9bc8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar9 = (ulong)(uint)p0->nTruePis + lVar10;
      iVar8 = (int)uVar9;
      if ((iVar8 < 0) || (p0->vCis->nSize <= iVar8)) goto LAB_006f9bc8;
      if ((*(int *)((long)p0->vCis->pArray[uVar9 & 0xffffffff] + 0x20) != p0->nTravIds) ==
          (*(int *)((long)p0->vCos->pArray[(ulong)uVar3 + lVar10] + 0x20) == p0->nTravIds)) {
        __assert_fail("Aig_ObjIsTravIdCurrent(p0, pObj0) == Aig_ObjIsTravIdCurrent(p0, pObj1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigWnd.c"
                      ,0x240,"Vec_Ptr_t *Saig_ManCollectedDiffNodes(Aig_Man_t *, Aig_Man_t *)");
      }
      lVar10 = lVar10 + 1;
    } while (p0->nRegs != lVar10);
  }
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Saig_ManCollectedDiffNodes( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj0, * pObj1;
    int i;
    // collect nodes that are not linked
    Aig_ManIncrementTravId( p0 );
    vNodes = Vec_PtrAlloc( 1000 );
    Aig_ManForEachObj( p0, pObj0, i )
    {
        pObj1 = Aig_ObjRepr( p0, pObj0 );
        if ( pObj1 != NULL )
        {
            assert( pObj0 == Aig_ObjRepr( p1, pObj1 ) );   
            continue;
        }
        // mark and collect unmatched objects
        Aig_ObjSetTravIdCurrent( p0, pObj0 ); 
        if ( Aig_ObjIsNode(pObj0) || Aig_ObjIsCi(pObj0) )
            Vec_PtrPush( vNodes, pObj0 );
    }
    // make sure LI/LO are labeled/unlabeled mutually
    Saig_ManForEachLiLo( p0, pObj0, pObj1, i )
        assert( Aig_ObjIsTravIdCurrent(p0, pObj0) == 
                Aig_ObjIsTravIdCurrent(p0, pObj1) );
    return vNodes;
}